

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Item * __thiscall World::add_item(World *this,Item *item)

{
  Item *pIVar1;
  byte bVar2;
  size_type sVar3;
  LandstalkerException *this_00;
  mapped_type *ppIVar4;
  string *__rhs;
  uint8_t local_cf [15];
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint8_t local_19;
  Item *local_18;
  Item *item_local;
  World *this_local;
  
  local_18 = item;
  item_local = (Item *)this;
  local_19 = Item::id(item);
  sVar3 = std::
          map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
          ::count(&this->_items,&local_19);
  pIVar1 = local_18;
  if (sVar3 != 0) {
    local_cf[1] = 1;
    this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    bVar2 = Item::id(local_18);
    std::__cxx11::to_string(&local_c0,(uint)bVar2);
    std::operator+(&local_a0,"Cannot add item #",&local_c0);
    std::operator+(&local_80,&local_a0," since there is already one with the same ID (");
    local_cf[2] = Item::id(local_18);
    ppIVar4 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::operator[](&this->_items,local_cf + 2);
    __rhs = Item::name_abi_cxx11_(*ppIVar4);
    std::operator+(&local_60,&local_80,__rhs);
    std::operator+(&local_40,&local_60,")");
    LandstalkerException::LandstalkerException(this_00,&local_40);
    local_cf[1] = 0;
    __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  local_cf[0] = Item::id(local_18);
  ppIVar4 = std::
            map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
            ::operator[](&this->_items,local_cf);
  *ppIVar4 = pIVar1;
  return local_18;
}

Assistant:

Item* World::add_item(Item* item)
{
    if(_items.count(item->id()))
        throw LandstalkerException("Cannot add item #" + std::to_string(item->id()) + " since there is already one with the same ID (" + _items[item->id()]->name() + ")");

    _items[item->id()] = item;
    return item;
}